

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day16a.cpp
# Opt level: O1

void day16a::almost_dragon_curve(string *data,int size)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (uint)data->_M_string_length;
  std::__cxx11::string::resize((ulong)data,(char)size);
  pcVar1 = (data->_M_dataplus)._M_p;
  do {
    uVar3 = ~uVar5 + size;
    if ((int)uVar5 <= (int)(~uVar5 + size)) {
      uVar3 = uVar5;
    }
    if (-1 < (int)uVar3) {
      pcVar1[(int)uVar5] = '0';
      if (uVar3 != 0) {
        uVar4 = 0;
        uVar2 = uVar5;
        do {
          uVar2 = uVar2 - 1;
          pcVar1[uVar4 + (long)(int)uVar5 + 1] = pcVar1[(int)uVar2] == '0' | 0x30;
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      uVar5 = uVar5 * 2 + 1;
    }
  } while (-1 < (int)uVar3);
  return;
}

Assistant:

void almost_dragon_curve(std::string& data, int size) {
		int len = data.size();
		data.resize(size);
		char* ptr = const_cast<char*>(data.data());
		for(;;) {
			int iterations = std::min(len, size - len - 1);
			if(iterations < 0) {
				break;
			}
			ptr[len] = '0';
			for(int i = 0; i < iterations; ++i) {
				ptr[len + i + 1] = ptr[len - i - 1] == '0' ? '1' : '0';
			}
			len = len * 2 + 1;
		}
	}